

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void ntileStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  sqlite3_context *pCtx_00;
  FuncDef *pFVar1;
  NtileCtx *p;
  sqlite3_context *in_stack_ffffffffffffffd8;
  
  pCtx_00 = (sqlite3_context *)sqlite3_aggregate_context(in_stack_ffffffffffffffd8,0);
  if (pCtx_00 != (sqlite3_context *)0x0) {
    if (pCtx_00->pOut == (Mem *)0x0) {
      pFVar1 = (FuncDef *)sqlite3_value_int64((sqlite3_value *)0x22aa69);
      pCtx_00->pFunc = pFVar1;
      if ((long)pCtx_00->pFunc < 1) {
        sqlite3_result_error(pCtx_00,(char *)in_stack_ffffffffffffffd8,0);
      }
    }
    pCtx_00->pOut = (Mem *)((long)&pCtx_00->pOut->u + 1);
  }
  return;
}

Assistant:

static void ntileStepFunc(
  sqlite3_context *pCtx,
  int nArg,
  sqlite3_value **apArg
){
  struct NtileCtx *p;
  assert( nArg==1 ); UNUSED_PARAMETER(nArg);
  p = (struct NtileCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    if( p->nTotal==0 ){
      p->nParam = sqlite3_value_int64(apArg[0]);
      if( p->nParam<=0 ){
        sqlite3_result_error(
            pCtx, "argument of ntile must be a positive integer", -1
        );
      }
    }
    p->nTotal++;
  }
}